

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert::queryH(LinearExpert *this,Z *z,X *x)

{
  Z *a;
  ResScalar RVar1;
  double dVar2;
  ResScalar RVar3;
  double dVar4;
  double dVar5;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_58;
  X *local_38 [2];
  
  local_58.m_lhs.m_rhs = &this->Nu;
  a = &this->dz;
  local_58.m_lhs.m_lhs = (LhsNested)z;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (a,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&local_58);
  local_58.m_lhs.m_lhs = &this->Lambda;
  local_58.m_rhs = &this->Mu;
  local_58.m_lhs.m_rhs = a;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->pred_x,&local_58);
  local_58.m_lhs.m_lhs = (LhsNested)x;
  local_58.m_lhs.m_rhs = &this->pred_x;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&this->dx,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_58);
  local_58.m_lhs.m_lhs = &this->invSigma;
  local_58.m_lhs.m_rhs = a;
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)a,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                 *)&local_58);
  dVar2 = exp(RVar1 * -0.5);
  dVar5 = this->sqrtDetInvSigma;
  local_38[0] = &this->dx;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_38,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->invPsi);
  dVar4 = exp(RVar3 * -0.5);
  dVar5 = dVar4 * dVar2 * dVar5 * this->sqrtDetInvPsi;
  this->h = dVar5;
  return dVar5;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryH( Z const &z, X const &x )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;
    dx = x - pred_x;

    h = exp(-0.5*dz.dot(invSigma * dz)) * sqrtDetInvSigma * exp(-0.5*dx.cwiseAbs2().dot(invPsi)) * sqrtDetInvPsi;

    return h;
}